

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O3

int32_t tnt_schema_stosid(tnt_schema *schema_obj,char *name,uint32_t name_len)

{
  uint uVar1;
  mh_assoc_t *pmVar2;
  mh_int_t *pmVar3;
  assoc_val *paVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  pmVar2 = schema_obj->space_hash;
  uVar5 = PMurHash32(0xd,name,name_len);
  uVar1 = pmVar2->n_buckets;
  uVar9 = (ulong)uVar5 % (ulong)uVar1;
  pmVar3 = pmVar2->b;
  while( true ) {
    uVar8 = (uint)uVar9;
    uVar7 = pmVar3[uVar9 >> 4];
    if ((((uVar7 >> (uVar8 & 0xf) & 1) != 0) &&
        (paVar4 = pmVar2->p[uVar9], (paVar4->key).id_len == name_len)) &&
       (iVar6 = bcmp(name,(paVar4->key).id,(ulong)name_len), iVar6 == 0)) break;
    if (((uVar7 >> (sbyte)(uVar8 & 0xf)) >> 0x10 & 1) == 0) {
      return -1;
    }
    uVar8 = uVar8 + uVar5 % (uVar1 - 1) + 1;
    uVar7 = uVar1;
    if (uVar8 < uVar1) {
      uVar7 = 0;
    }
    uVar9 = (ulong)(uVar8 - uVar7);
  }
  if (uVar8 == uVar1) {
    return -1;
  }
  return *(int32_t *)((long)paVar4->data + 0xc);
}

Assistant:

int32_t tnt_schema_stosid(struct tnt_schema *schema_obj, const char *name,
			  uint32_t name_len) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	struct assoc_key space_key = {name, name_len};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	const struct tnt_schema_sval *space =
		(*mh_assoc_node(schema, space_slot))->data;
	return space->number;
}